

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O0

ex_ex * ex_if(t_expr *e,ex_ex *eptr,ex_ex *optr,ex_ex *argv,int idx)

{
  t_float tVar1;
  t_float tVar2;
  long lVar3;
  ex_ex *peVar4;
  t_float *ptVar5;
  ex_ex *optr_00;
  ex_ex *optr_01;
  bool bVar6;
  float fVar7;
  int local_84;
  int condtrue;
  int j;
  t_float rightvalue;
  t_float leftvalue;
  t_float *cp;
  t_float *rp;
  t_float *lp;
  t_float *op;
  ex_ex *res;
  ex_ex *cond;
  ex_ex *right;
  ex_ex *left;
  int idx_local;
  ex_ex *argv_local;
  ex_ex *optr_local;
  ex_ex *eptr_local;
  t_expr *e_local;
  
  peVar4 = ex_eval(e,eptr,argv,idx);
  optr_00 = argv + 1;
  switch(argv->ex_type) {
  case 1:
    bVar6 = (argv->ex_cont).v_int != 0;
    break;
  case 2:
    if (((argv->ex_cont).v_flt != 0.0) || (NAN((argv->ex_cont).v_flt))) {
      bVar6 = true;
    }
    else {
      bVar6 = false;
    }
    break;
  case 7:
  default:
    pd_error(e,"expr: FUNC_EVAL(%d): bad condition type %ld\n",0x4ae,argv->ex_type);
    return peVar4;
  case 0xe:
  case 0xf:
    if (optr->ex_type != 0xf) {
      if (optr->ex_type == 0xe) {
        post("expr~: Int. error %d",0x407);
        return peVar4;
      }
      optr->ex_type = 0xf;
      ptVar5 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar5;
      if ((optr->ex_cont).v_int == 0) {
        post("expr:if: no mem");
        return argv->ex_end->ex_end;
      }
    }
    peVar4 = ex_eval(e,peVar4,optr_00,idx);
    optr_01 = argv + 2;
    peVar4 = ex_eval(e,peVar4,optr_01,idx);
    lp = (optr->ex_cont).v_vec;
    local_84 = e->exp_vsize;
    _rightvalue = (argv->ex_cont).v_vec;
    switch(argv[1].ex_type) {
    case 1:
      fVar7 = (float)(optr_00->ex_cont).v_int;
      switch(argv[2].ex_type) {
      case 1:
        lVar3 = (optr_01->ex_cont).v_int;
        while (local_84 != 0) {
          if ((*_rightvalue != 0.0) || (NAN(*_rightvalue))) {
            *lp = fVar7;
          }
          else {
            *lp = (float)lVar3;
          }
          lp = lp + 1;
          local_84 = local_84 + -1;
          _rightvalue = _rightvalue + 1;
        }
        return peVar4;
      case 2:
        tVar1 = (optr_01->ex_cont).v_flt;
        while (local_84 != 0) {
          if ((*_rightvalue != 0.0) || (NAN(*_rightvalue))) {
            *lp = fVar7;
          }
          else {
            *lp = tVar1;
          }
          lp = lp + 1;
          local_84 = local_84 + -1;
          _rightvalue = _rightvalue + 1;
        }
        return peVar4;
      case 7:
        break;
      case 0xe:
      case 0xf:
        cp = (optr_01->ex_cont).v_vec;
        while (local_84 != 0) {
          if ((*_rightvalue != 0.0) || (NAN(*_rightvalue))) {
            *lp = fVar7;
          }
          else {
            *lp = *cp;
          }
          lp = lp + 1;
          cp = cp + 1;
          local_84 = local_84 + -1;
          _rightvalue = _rightvalue + 1;
        }
        return peVar4;
      }
      pd_error(e,"expr: FUNC_EVAL(%d): bad right type %ld\n",0x443,argv[2].ex_type);
      return peVar4;
    case 2:
      tVar1 = (optr_00->ex_cont).v_flt;
      switch(argv[2].ex_type) {
      case 1:
        lVar3 = (optr_01->ex_cont).v_int;
        while (local_84 != 0) {
          if ((*_rightvalue != 0.0) || (NAN(*_rightvalue))) {
            *lp = tVar1;
          }
          else {
            *lp = (float)lVar3;
          }
          lp = lp + 1;
          local_84 = local_84 + -1;
          _rightvalue = _rightvalue + 1;
        }
        return peVar4;
      case 2:
        tVar2 = (optr_01->ex_cont).v_flt;
        while (local_84 != 0) {
          if ((*_rightvalue != 0.0) || (NAN(*_rightvalue))) {
            *lp = tVar1;
          }
          else {
            *lp = tVar2;
          }
          lp = lp + 1;
          local_84 = local_84 + -1;
          _rightvalue = _rightvalue + 1;
        }
        return peVar4;
      case 7:
        break;
      case 0xe:
      case 0xf:
        cp = (optr_01->ex_cont).v_vec;
        while (local_84 != 0) {
          if ((*_rightvalue != 0.0) || (NAN(*_rightvalue))) {
            *lp = tVar1;
          }
          else {
            *lp = *cp;
          }
          lp = lp + 1;
          cp = cp + 1;
          local_84 = local_84 + -1;
          _rightvalue = _rightvalue + 1;
        }
        return peVar4;
      }
      pd_error(e,"expr: FUNC_EVAL(%d): bad right type %ld\n",0x46a,argv[2].ex_type);
      return peVar4;
    case 7:
      break;
    case 0xe:
    case 0xf:
      rp = (optr_00->ex_cont).v_vec;
      switch(argv[2].ex_type) {
      case 1:
        lVar3 = (optr_01->ex_cont).v_int;
        while (local_84 != 0) {
          if ((*_rightvalue != 0.0) || (NAN(*_rightvalue))) {
            *lp = *rp;
          }
          else {
            *lp = (float)lVar3;
          }
          lp = lp + 1;
          rp = rp + 1;
          local_84 = local_84 + -1;
          _rightvalue = _rightvalue + 1;
        }
        return peVar4;
      case 2:
        tVar1 = (optr_01->ex_cont).v_flt;
        while (local_84 != 0) {
          if ((*_rightvalue != 0.0) || (NAN(*_rightvalue))) {
            *lp = *rp;
          }
          else {
            *lp = tVar1;
          }
          lp = lp + 1;
          rp = rp + 1;
          local_84 = local_84 + -1;
          _rightvalue = _rightvalue + 1;
        }
        return peVar4;
      case 7:
        break;
      case 0xe:
      case 0xf:
        cp = (optr_01->ex_cont).v_vec;
        while (local_84 != 0) {
          if ((*_rightvalue != 0.0) || (NAN(*_rightvalue))) {
            *lp = *rp;
          }
          else {
            *lp = *cp;
          }
          lp = lp + 1;
          rp = rp + 1;
          cp = cp + 1;
          local_84 = local_84 + -1;
          _rightvalue = _rightvalue + 1;
        }
        return peVar4;
      }
      pd_error(e,"expr: FUNC_EVAL(%d): bad right type %ld\n",0x494,argv[2].ex_type);
      return peVar4;
    }
    pd_error(e,"expr: FUNC_EVAL(%d): bad left type %ld\n",0x49b,argv[1].ex_type);
    return peVar4;
  }
  if (bVar6) {
    peVar4 = ex_eval(e,peVar4,optr_00,idx);
    if (peVar4 == (ex_ex *)0x0) {
      return (ex_ex *)0x0;
    }
    optr_local = peVar4->ex_end;
  }
  else {
    if (peVar4 == (ex_ex *)0x0) {
      return (ex_ex *)0x0;
    }
    optr_local = ex_eval(e,peVar4->ex_end,optr_00,idx);
  }
  switch(argv[1].ex_type) {
  case 1:
    if (optr->ex_type == 0xf) {
      ex_mkvector((optr->ex_cont).v_vec,(float)(optr_00->ex_cont).v_int,e->exp_vsize);
    }
    else {
      optr->ex_cont = optr_00->ex_cont;
      optr->ex_type = argv[1].ex_type;
      optr->ex_end = argv[1].ex_end;
    }
    break;
  case 2:
    if (optr->ex_type == 0xf) {
      ex_mkvector((optr->ex_cont).v_vec,(optr_00->ex_cont).v_flt,e->exp_vsize);
    }
    else {
      optr->ex_cont = optr_00->ex_cont;
      optr->ex_type = argv[1].ex_type;
      optr->ex_end = argv[1].ex_end;
    }
    break;
  case 7:
  default:
    pd_error(e,"expr: FUNC_EVAL(%d): bad res type %ld\n",0x4e6,argv[1].ex_type);
    break;
  case 0xe:
  case 0xf:
    if (optr->ex_type != 0xf) {
      if (optr->ex_type == 0xe) {
        post("expr~: Int. error %d",0x4d5);
        return optr_local;
      }
      optr->ex_type = 0xf;
      ptVar5 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar5;
      if ((optr->ex_cont).v_int == 0) {
        post("expr:if: no mem");
        return optr_local;
      }
    }
    memcpy((optr->ex_cont).v_vec,(optr_00->ex_cont).v_vec,(long)e->exp_vsize << 2);
  }
  return optr_local;
}

Assistant:

struct ex_ex *
ex_if(t_expr *e, struct ex_ex *eptr, struct ex_ex *optr, struct ex_ex *argv, int idx)
{
        struct ex_ex *left, *right, *cond, *res;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float *cp;              /* condition pointer */
        t_float leftvalue, rightvalue;
        int j;
                int condtrue = 0;

                // evaluate the condition
                eptr = ex_eval(e, eptr, argv, idx);
        cond = argv++;
                // only either the left or right will be evaluated depending
                // on the truth value of the condition
                // However, if the condition is a vector, both args will be evaluated

        switch (cond->ex_type) {
        case ET_VEC:
        case ET_VI:
                if (optr->ex_type != ET_VEC) {
                        if (optr->ex_type == ET_VI) {
                                /* SDY remove this test */
                                post("expr~: Int. error %d", __LINE__);
                                return (eptr);
                        }
                        optr->ex_type = ET_VEC;
                        optr->ex_vec = (t_float *)
                                  fts_malloc(sizeof (t_float) * e->exp_vsize);
                                                if (!optr->ex_vec) {
                                                        post("expr:if: no mem");
                                                        /* pass over the left and right args */
                                                        return(cond->ex_end->ex_end);
                                                }
                }
                                /*
                                 * if the condition is a vector
                                 * the left and the right args both will get processed
                                 */
                                eptr = ex_eval(e, eptr, argv, idx);
                                left = argv++;
                                eptr = ex_eval(e, eptr, argv, idx);
                                right = argv;
                op = optr->ex_vec;
                j = e->exp_vsize;
                cp = cond->ex_vec;
                switch (left->ex_type) {
                case ET_INT:
                        leftvalue = left->ex_int;
                        switch (right->ex_type) {
                        case ET_INT:
                                rightvalue = right->ex_int;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = leftvalue;
                                        else
                                                *op++ = rightvalue;
                                }
                        return (eptr);
                        case ET_FLT:
                                rightvalue = right->ex_flt;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = leftvalue;
                                        else
                                                *op++ = rightvalue;
                                }
                                return (eptr);
                        case ET_VEC:
                        case ET_VI:
                                rp = right->ex_vec;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = leftvalue;
                                        else
                                                *op++ = *rp;
                                        rp++;
                                }
                                return (eptr);
                        case ET_SYM:
                        default:
                                post_error((fts_object_t *) e,
                              "expr: FUNC_EVAL(%d): bad right type %ld\n",
                                                      __LINE__, right->ex_type);
                                return (eptr);
                        }
                case ET_FLT:
                        leftvalue = left->ex_flt;
                        switch (right->ex_type) {
                        case ET_INT:
                                rightvalue = right->ex_int;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = leftvalue;
                                        else
                                                *op++ = rightvalue;
                                }
                                return (eptr);
                        case ET_FLT:
                                rightvalue = right->ex_flt;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = leftvalue;
                                        else
                                                *op++ = rightvalue;
                                }
                                return (eptr);
                        case ET_VEC:
                        case ET_VI:
                                rp = right->ex_vec;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = leftvalue;
                                        else
                                                *op++ = *rp;
                                        rp++;
                                }
                                return (eptr);
                        case ET_SYM:
                        default:
                                post_error((fts_object_t *) e,
                              "expr: FUNC_EVAL(%d): bad right type %ld\n",
                                                      __LINE__, right->ex_type);
                                return (eptr);
                        }
                case ET_VEC:
                case ET_VI:
                        lp = left->ex_vec;
                        switch (right->ex_type) {
                        case ET_INT:
                                rightvalue = right->ex_int;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = *lp;
                                        else
                                                *op++ = rightvalue;
                                        lp++;
                                }
                                return (eptr);
                        case ET_FLT:
                                rightvalue = right->ex_flt;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = *lp;
                                        else
                                                *op++ = rightvalue;
                                        lp++;
                                }
                                return (eptr);
                        case ET_VEC:
                        case ET_VI:
                                rp = right->ex_vec;
                                while (j--) {
                                        if (*cp++)
                                                *op++ = *lp;
                                        else
                                                *op++ = *rp;
                                        lp++; rp++;
                                }
                                return (eptr);
                        case ET_SYM:
                        default:
                                post_error((fts_object_t *) e,
                              "expr: FUNC_EVAL(%d): bad right type %ld\n",
                                                      __LINE__, right->ex_type);
                                return (eptr);
                        }
                case ET_SYM:
                default:
                        post_error((fts_object_t *) e,
                      "expr: FUNC_EVAL(%d): bad left type %ld\n",
                                              __LINE__, left->ex_type);
                        return (eptr);
                }
        case ET_INT:
                if (cond->ex_int)
                        condtrue = 1;
                else
                        condtrue = 0;
                break;
        case ET_FLT:
                if (cond->ex_flt)
                        condtrue = 1;
                else
                        condtrue = 0;
                break;
        case ET_SYM:
        default:
                post_error((fts_object_t *) e,
              "expr: FUNC_EVAL(%d): bad condition type %ld\n",
                                      __LINE__, cond->ex_type);
                return (eptr);
        }
                if (condtrue) {
                        eptr = ex_eval(e, eptr, argv, idx);
                        res = argv++;
                        if (!eptr)
                                return (exNULL);
                        eptr = eptr->ex_end; /* no right processing */

                } else {
                        if (!eptr)
                                return (exNULL);
                        eptr = eptr->ex_end; /* no left rocessing */
                        eptr = ex_eval(e, eptr, argv, idx);
                        res = argv++;
                }
        switch(res->ex_type) {
        case ET_INT:
                if (optr->ex_type == ET_VEC) {
                        ex_mkvector(optr->ex_vec, (t_float)res->ex_int,
                                                                e->exp_vsize);
                        return (eptr);
                }
                *optr = *res;
                return (eptr);
        case ET_FLT:
                if (optr->ex_type == ET_VEC) {
                        ex_mkvector(optr->ex_vec, (t_float)res->ex_flt,
                                                                e->exp_vsize);
                        return (eptr);
                }
                *optr = *res;
                return (eptr);
        case ET_VEC:
        case ET_VI:
                if (optr->ex_type != ET_VEC) {
                        if (optr->ex_type == ET_VI) {
                                /* SDY remove this test */
                                post("expr~: Int. error %d", __LINE__);
                                return (eptr);
                        }
                        optr->ex_type = ET_VEC;
                        optr->ex_vec = (t_float *)
                                  fts_malloc(sizeof (t_float) * e->exp_vsize);
                                                if (!optr->ex_vec) {
                                                        post("expr:if: no mem");
                            return (eptr);
                                                }
                }
                memcpy(optr->ex_vec, res->ex_vec, e->exp_vsize*sizeof(t_float));
                return (eptr);
        case ET_SYM:
        default:
                post_error((fts_object_t *) e,
              "expr: FUNC_EVAL(%d): bad res type %ld\n",
                                      __LINE__, res->ex_type);
                return (eptr);
        }

}